

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree.cpp
# Opt level: O0

void __thiscall
ParseNodeExportDefault::ParseNodeExportDefault
          (ParseNodeExportDefault *this,OpCode nop,charcount_t ichMin,charcount_t ichLim)

{
  charcount_t ichLim_local;
  charcount_t ichMin_local;
  OpCode nop_local;
  ParseNodeExportDefault *this_local;
  
  ParseNode::ParseNode(&this->super_ParseNode,nop,ichMin,ichLim);
  return;
}

Assistant:

ParseNodeExportDefault::ParseNodeExportDefault(OpCode nop, charcount_t ichMin, charcount_t ichLim)
    : ParseNode(nop, ichMin, ichLim)
{
}